

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O3

void __thiscall
fizplex::LPTestFeasibility_IsFeasibleForBoundedVarAndRangeRow_Test::TestBody
          (LPTestFeasibility_IsFeasibleForBoundedVarAndRangeRow_Test *this)

{
  LP *this_00;
  long lVar1;
  initializer_list<double> l;
  initializer_list<double> l_00;
  initializer_list<double> l_01;
  initializer_list<fizplex::DVector> __l;
  initializer_list<double> l_02;
  initializer_list<double> l_03;
  initializer_list<fizplex::DVector> __l_00;
  allocator_type local_a9;
  vector<fizplex::DVector,_std::allocator<fizplex::DVector>_> local_a8;
  DVector local_90;
  DVector local_78;
  DVector local_60;
  double local_48 [2];
  undefined1 *local_38;
  undefined8 uStack_30;
  double local_28 [2];
  
  this_00 = &(this->super_LPTestFeasibility).lp;
  LP::add_column(this_00,Bounded,-1.0,5.0,0.0);
  LP::add_row(this_00,Range,-3.0,7.0);
  LP::add_value(this_00,0,0,2.0);
  LP::add_logicals(this_00);
  local_28[0] = 0.0;
  local_28[1] = 7.0;
  l._M_len = 2;
  l._M_array = local_28;
  DVector::DVector(&local_90,l);
  local_38 = &DAT_bff0000000000000;
  uStack_30 = 0x4022000000000000;
  l_00._M_len = 2;
  l_00._M_array = (iterator)&local_38;
  DVector::DVector(&local_78,l_00);
  local_48[0] = 3.5;
  local_48[1] = 0.0;
  l_01._M_len = 2;
  l_01._M_array = local_48;
  DVector::DVector(&local_60,l_01);
  __l._M_len = 3;
  __l._M_array = &local_90;
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::vector(&local_a8,__l,&local_a9);
  LPTestFeasibility::check_feasible(&this->super_LPTestFeasibility,true,&local_a8);
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::~vector(&local_a8);
  lVar1 = 0x48;
  do {
    operator_delete(*(void **)((long)&local_a8.
                                      super__Vector_base<fizplex::DVector,_std::allocator<fizplex::DVector>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != 0);
  local_28[0] = -1.5;
  local_28[1] = 0.0;
  l_02._M_len = 2;
  l_02._M_array = local_28;
  DVector::DVector(&local_90,l_02);
  local_38 = (undefined1 *)0x4010000000000000;
  uStack_30 = 0;
  l_03._M_len = 2;
  l_03._M_array = (iterator)&local_38;
  DVector::DVector(&local_78,l_03);
  __l_00._M_len = 2;
  __l_00._M_array = &local_90;
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::vector
            (&local_a8,__l_00,(allocator_type *)local_48);
  LPTestFeasibility::check_feasible(&this->super_LPTestFeasibility,false,&local_a8);
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::~vector(&local_a8);
  lVar1 = 0x30;
  do {
    operator_delete(*(void **)((long)&local_a8.
                                      super__Vector_base<fizplex::DVector,_std::allocator<fizplex::DVector>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != 0);
  return;
}

Assistant:

TEST_F(LPTestFeasibility, IsFeasibleForBoundedVarAndRangeRow) {
  lp.add_column(ColType::Bounded, -1.0, 5);
  lp.add_row(RowType::Range, -3, 7);
  lp.add_value(0, 0, 2.0);
  lp.add_logicals();

  check_feasible(true, {{0, 7}, {-1, 9}, {3.5, 0}});
  check_feasible(false, {{-1.5, 0}, {4, 0}});
}